

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

int __thiscall ncnn::Clip::forward_inplace_int8(Clip *this,Mat *bottom_top_blob,Option *opt)

{
  char cVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  char cVar12;
  float fVar13;
  float fVar14;
  
  iVar2 = bottom_top_blob->c;
  fVar14 = this->max;
  fVar13 = roundf(this->min);
  iVar4 = (int)fVar13;
  if ((int)fVar13 < -0x7e) {
    iVar4 = -0x7f;
  }
  if (0x7e < iVar4) {
    iVar4 = 0x7f;
  }
  fVar14 = roundf(fVar14);
  iVar8 = -0x7f;
  if (-0x7f < (int)fVar14) {
    iVar8 = (int)fVar14;
  }
  if (0x7e < iVar8) {
    iVar8 = 0x7f;
  }
  if (0 < (long)iVar2) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w;
    lVar6 = 0;
    cVar12 = (char)iVar4;
    cVar7 = (char)iVar8;
    do {
      if (0 < (int)uVar5) {
        lVar9 = bottom_top_blob->elemsize * bottom_top_blob->cstep * lVar6;
        pvVar3 = bottom_top_blob->data;
        uVar10 = 0;
        do {
          cVar1 = *(char *)((long)pvVar3 + uVar10 + lVar9);
          cVar11 = cVar1;
          if (cVar1 <= cVar12) {
            cVar11 = cVar12;
          }
          if ((cVar1 < cVar12) || (cVar7 < cVar11)) {
            if (cVar7 <= cVar11) {
              cVar11 = cVar7;
            }
            *(char *)((long)pvVar3 + uVar10 + lVar9) = cVar11;
          }
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar2);
  }
  return 0;
}

Assistant:

int Clip::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    signed char min_int8 = float2int8(min);
    signed char max_int8 = float2int8(max);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        signed char* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < min_int8)
                ptr[i] = min_int8;
            if (ptr[i] > max_int8)
                ptr[i] = max_int8;
        }
    }

    return 0;
}